

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::GetElementType
                   (uint32_t type_id,iterator start,iterator end,DefUseManager *def_use_manager)

{
  bool bVar1;
  Op OVar2;
  reference pOVar3;
  Instruction *this;
  size_t sVar4;
  uint *puVar5;
  Instruction *type_inst;
  Operand index;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  __end2;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  __begin2;
  IteratorRange<__gnu_cxx::__normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>_>
  *__range2;
  DefUseManager *def_use_manager_local;
  iterator iStack_20;
  uint32_t type_id_local;
  iterator end_local;
  iterator start_local;
  
  iStack_20._M_current = end._M_current;
  end_local = start;
  ___begin2 = make_range<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                        (&end_local,&stack0xffffffffffffffe0);
  __end2 = IteratorRange<__gnu_cxx::__normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>_>
           ::begin((IteratorRange<__gnu_cxx::__normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>_>
                    *)&__begin2);
  index.words.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )IteratorRange<__gnu_cxx::__normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>_>
                   ::end((IteratorRange<__gnu_cxx::__normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>_>
                          *)&__begin2);
  def_use_manager_local._4_4_ = type_id;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
                                *)&index.words.large_data_);
    if (!bVar1) {
      return def_use_manager_local._4_4_;
    }
    pOVar3 = __gnu_cxx::
             __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
             ::operator*(&__end2);
    Operand::Operand((Operand *)&type_inst,pOVar3);
    this = analysis::DefUseManager::GetDef(def_use_manager,def_use_manager_local._4_4_);
    bVar1 = false;
    if ((int)type_inst == 6) {
      sVar4 = utils::SmallVector<unsigned_int,_2UL>::size((SmallVector<unsigned_int,_2UL> *)&index);
      bVar1 = sVar4 == 1;
    }
    if (!bVar1) {
      __assert_fail("index.type == SPV_OPERAND_TYPE_LITERAL_INTEGER && index.words.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x6a8,
                    "uint32_t spvtools::opt::(anonymous namespace)::GetElementType(uint32_t, Instruction::iterator, Instruction::iterator, const analysis::DefUseManager *)"
                   );
    }
    OVar2 = opt::Instruction::opcode(this);
    if (OVar2 == OpTypeArray) {
      def_use_manager_local._4_4_ = opt::Instruction::GetSingleWordInOperand(this,0);
LAB_00966dc6:
      bVar1 = false;
    }
    else {
      OVar2 = opt::Instruction::opcode(this);
      if (OVar2 == OpTypeMatrix) {
        def_use_manager_local._4_4_ = opt::Instruction::GetSingleWordInOperand(this,0);
        goto LAB_00966dc6;
      }
      OVar2 = opt::Instruction::opcode(this);
      if (OVar2 == OpTypeStruct) {
        puVar5 = utils::SmallVector<unsigned_int,_2UL>::operator[]
                           ((SmallVector<unsigned_int,_2UL> *)&index,0);
        def_use_manager_local._4_4_ = opt::Instruction::GetSingleWordInOperand(this,*puVar5);
        goto LAB_00966dc6;
      }
      start_local._M_current._4_4_ = 0;
      bVar1 = true;
    }
    Operand::~Operand((Operand *)&type_inst);
    if (bVar1) {
      return start_local._M_current._4_4_;
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

uint32_t GetElementType(uint32_t type_id, Instruction::iterator start,
                        Instruction::iterator end,
                        const analysis::DefUseManager* def_use_manager) {
  for (auto index : make_range(std::move(start), std::move(end))) {
    const Instruction* type_inst = def_use_manager->GetDef(type_id);
    assert(index.type == SPV_OPERAND_TYPE_LITERAL_INTEGER &&
           index.words.size() == 1);
    if (type_inst->opcode() == spv::Op::OpTypeArray) {
      type_id = type_inst->GetSingleWordInOperand(0);
    } else if (type_inst->opcode() == spv::Op::OpTypeMatrix) {
      type_id = type_inst->GetSingleWordInOperand(0);
    } else if (type_inst->opcode() == spv::Op::OpTypeStruct) {
      type_id = type_inst->GetSingleWordInOperand(index.words[0]);
    } else {
      return 0;
    }
  }
  return type_id;
}